

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

void __thiscall CVmObjStringBuffer::apply_undo(CVmObjStringBuffer *this,CVmUndoRecord *undo_rec)

{
  int *__ptr;
  int del_chars;
  int iVar1;
  wchar_t *src;
  int ins_chars;
  
  __ptr = (int *)(undo_rec->id).ptrval;
  if (__ptr == (int *)0x0) {
    return;
  }
  iVar1 = *__ptr;
  if (iVar1 == 2) {
    del_chars = __ptr[3];
    src = __ptr + 4;
    iVar1 = __ptr[1];
    ins_chars = __ptr[2];
  }
  else if (iVar1 == 1) {
    src = __ptr + 4;
    iVar1 = __ptr[1];
    ins_chars = __ptr[2];
    del_chars = 0;
  }
  else {
    if (iVar1 != 0) goto LAB_002ba1fb;
    iVar1 = __ptr[1];
    del_chars = __ptr[3];
    src = (wchar_t *)0x0;
    ins_chars = 0;
  }
  splice_text(this,undo_rec->obj,iVar1,del_chars,src,ins_chars,0);
LAB_002ba1fb:
  free(__ptr);
  (undo_rec->id).ptrval = (void *)0x0;
  return;
}

Assistant:

void CVmObjStringBuffer::apply_undo(VMG_ struct CVmUndoRecord *undo_rec)
{
    if (undo_rec->id.ptrval != 0)
    {
        strbuf_undo_rec *rec;
        vm_obj_id_t self = undo_rec->obj;

        /* get our private record from the standard undo record */
        rec = (strbuf_undo_rec *)undo_rec->id.ptrval;

        /* check the action in the record */
        switch(rec->action)
        {
        case STRBUF_UNDO_INS:
            /* we inserted text into the buffer; delete the new text */
            delete_text(vmg_ self, rec->idx, rec->new_len, FALSE);
            break;

        case STRBUF_UNDO_DEL:
            /* we deleted text; re-insert the old text */
            insert_text(vmg_ self, rec->idx, rec->str, rec->old_len, FALSE);
            break;

        case STRBUF_UNDO_REPL:
            /* we replaced text; splice the old text in place of the new */
            splice_text(vmg_ self,
                        rec->idx, rec->new_len, rec->str, rec->old_len,
                        FALSE);
            break;
        }

        /* discard the private record */
        t3free(rec);

        /* clear the pointer in the main record so we know it's gone */
        undo_rec->id.ptrval = 0;
    }
}